

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.cpp
# Opt level: O0

void __thiscall
NonFatalCheckError::NonFatalCheckError
          (NonFatalCheckError *this,string_view msg,string_view file,int line,string_view func)

{
  long lVar1;
  string_view file_00;
  string_view msg_00;
  char *in_RCX;
  char *in_RSI;
  runtime_error *in_RDI;
  size_t in_R8;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000008;
  size_t in_stack_00000010;
  string local_28 [8];
  string_view in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  msg_00._M_str = in_RSI;
  msg_00._M_len = in_R8;
  file_00._M_str = in_RCX;
  file_00._M_len = in_stack_00000010;
  StrFormatInternalBug_abi_cxx11_
            (msg_00,file_00,(int)((ulong)in_stack_00000008 >> 0x20),in_stack_ffffffffffffffe0);
  std::runtime_error::runtime_error(in_RDI,local_28);
  std::__cxx11::string::~string(in_stack_00000008);
  *(undefined ***)in_RDI = &PTR__NonFatalCheckError_023cd6e0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

NonFatalCheckError::NonFatalCheckError(std::string_view msg, std::string_view file, int line, std::string_view func)
    : std::runtime_error{StrFormatInternalBug(msg, file, line, func)}
{
}